

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::calculateProblemRanges(SPxSolverBase<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  int j;
  long lVar8;
  double dVar9;
  double local_80;
  
  pdVar7 = (double *)infinity();
  local_80 = *pdVar7;
  pdVar7 = (double *)infinity();
  dVar1 = *pdVar7;
  pdVar7 = (double *)infinity();
  dVar2 = *pdVar7;
  dVar6 = 0.0;
  dVar5 = 0.0;
  for (lVar8 = 0;
      lVar8 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar8 = lVar8 + 1) {
    dVar3 = ABS((this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar8]);
    dVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar8];
    pdVar7 = (double *)infinity();
    if (dVar3 < *pdVar7) {
      if (dVar3 <= dVar1) {
        dVar1 = dVar3;
      }
      if (dVar6 <= dVar3) {
        dVar6 = dVar3;
      }
    }
    pdVar7 = (double *)infinity();
    if (dVar3 < *pdVar7) {
      if (dVar3 <= dVar1) {
        dVar1 = dVar3;
      }
      if (dVar6 <= dVar3) {
        dVar6 = dVar3;
      }
    }
    dVar9 = ABS(dVar9);
    if (dVar9 <= local_80) {
      local_80 = dVar9;
    }
    if (dVar5 <= dVar9) {
      dVar5 = dVar9;
    }
  }
  dVar9 = 0.0;
  for (lVar8 = 0;
      lVar8 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar8 = lVar8 + 1) {
    dVar4 = ABS((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar8]);
    dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar8];
    pdVar7 = (double *)infinity();
    if (*pdVar7 <= dVar4 && dVar4 != *pdVar7) {
      if (dVar4 <= dVar2) {
        dVar2 = dVar4;
      }
      if (dVar9 <= dVar4) {
        dVar9 = dVar4;
      }
    }
    pdVar7 = (double *)infinity();
    dVar3 = ABS(dVar3);
    if (dVar3 < *pdVar7) {
      if (dVar3 <= dVar2) {
        dVar2 = dVar3;
      }
      if (dVar9 <= dVar3) {
        dVar9 = dVar3;
      }
    }
  }
  this->boundrange = dVar6 - dVar1;
  this->siderange = dVar9 - dVar2;
  this->objrange = dVar5 - local_80;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}